

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O3

void regularizer_to_weight<sparse_parameters>(vw *param_1,bfgs *b,sparse_parameters *weights)

{
  _Hash_node_base *p_Var1;
  ulong uVar2;
  
  if (b->regularizers != (weight *)0x0) {
    for (p_Var1 = (weights->_map)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
        p_Var1 = p_Var1->_M_nxt) {
      uVar2 = (ulong)p_Var1[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f);
      *(weight *)((long)&p_Var1[2]._M_nxt[1]._M_nxt + 4) = b->regularizers[uVar2 * 2];
      *(weight *)&(p_Var1[2]._M_nxt)->_M_nxt = b->regularizers[uVar2 * 2 + 1];
    }
  }
  return;
}

Assistant:

void regularizer_to_weight(vw& /* all */, bfgs& b, T& weights)
{
  if (b.regularizers != nullptr)
  {
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      uint64_t i = w.index() >> weights.stride_shift();
      (&(*w))[W_COND] = b.regularizers[2 * i];
      *w = b.regularizers[2 * i + 1];
    }
  }
}